

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

void __thiscall
Catch::AutomakeReporter::testCaseEnded(AutomakeReporter *this,TestCaseStats *_testCaseStats)

{
  bool bVar1;
  ostream *poVar2;
  TestCaseStats *in_RSI;
  StreamingReporterBase *in_RDI;
  
  std::operator<<((in_RDI->super_ReporterBase).m_stream,":test-result: ");
  if ((in_RSI->totals).testCases.skipped == 0) {
    bVar1 = Counts::allPassed(&(in_RSI->totals).assertions);
    if (bVar1) {
      std::operator<<((in_RDI->super_ReporterBase).m_stream,"PASS");
    }
    else {
      bVar1 = Counts::allOk(&(in_RSI->totals).assertions);
      if (bVar1) {
        std::operator<<((in_RDI->super_ReporterBase).m_stream,"XFAIL");
      }
      else {
        std::operator<<((in_RDI->super_ReporterBase).m_stream,"FAIL");
      }
    }
  }
  else {
    std::operator<<((in_RDI->super_ReporterBase).m_stream,"SKIP");
  }
  poVar2 = std::operator<<((in_RDI->super_ReporterBase).m_stream,' ');
  poVar2 = std::operator<<(poVar2,(string *)in_RSI->testInfo);
  std::operator<<(poVar2,'\n');
  StreamingReporterBase::testCaseEnded(in_RDI,in_RSI);
  return;
}

Assistant:

void AutomakeReporter::testCaseEnded(TestCaseStats const& _testCaseStats) {
        // Possible values to emit are PASS, XFAIL, SKIP, FAIL, XPASS and ERROR.
        m_stream << ":test-result: ";
        if ( _testCaseStats.totals.testCases.skipped > 0 ) {
            m_stream << "SKIP";
        } else if (_testCaseStats.totals.assertions.allPassed()) {
            m_stream << "PASS";
        } else if (_testCaseStats.totals.assertions.allOk()) {
            m_stream << "XFAIL";
        } else {
            m_stream << "FAIL";
        }
        m_stream << ' ' << _testCaseStats.testInfo->name << '\n';
        StreamingReporterBase::testCaseEnded(_testCaseStats);
    }